

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::ConfigFlagsTable::EnableExperimentalFlag(ConfigFlagsTable *this)

{
  AutoCriticalSection local_18;
  AutoCriticalSection autocs;
  ConfigFlagsTable *this_local;
  
  autocs.cs = (CriticalSection *)this;
  AutoCriticalSection::AutoCriticalSection(&local_18,&this->csExperimentalFlags);
  SetAsBoolean(this,WasmSimdFlag,true);
  SetAsBoolean(this,ESDynamicImportFlag,true);
  SetAsBoolean(this,ES6RegExPrototypePropertiesFlag,true);
  SetAsBoolean(this,ES6RegExSymbolsFlag,true);
  SetAsBoolean(this,ESSharedArrayBufferFlag,true);
  AutoCriticalSection::~AutoCriticalSection(&local_18);
  return;
}

Assistant:

void
    ConfigFlagsTable::EnableExperimentalFlag()
    {
        AutoCriticalSection autocs(&csExperimentalFlags);
#define FLAG_EXPERIMENTAL(type, name, ...) this->SetAsBoolean(Js::Flag::name##Flag, true);
#include "ConfigFlagsList.h"
    }